

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128crc.cpp
# Opt level: O1

void metrohash128crc_1(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  puVar1 = (uint *)(key + len);
  lVar8 = (ulong)seed * 0x2f5870a5;
  uVar2 = len + 0xdaf812fade1589fb + lVar8;
  lVar4 = (ulong)seed * 0x7bdec03b;
  uVar6 = len + 0x40f9d9a67898eb79 + lVar4;
  if (0x1f < len) {
    uVar7 = lVar4 + len + 0x60e25d3baf065edb;
    uVar5 = lVar8 + len + 0xe72a3b80ca927bd9;
    do {
      uVar3 = crc32(uVar2,*(undefined8 *)key);
      uVar2 = uVar3 ^ uVar2;
      uVar3 = crc32(uVar6,*(undefined8 *)((long)key + 8));
      uVar6 = uVar3 ^ uVar6;
      uVar3 = crc32(uVar7,*(undefined8 *)((long)key + 0x10));
      uVar7 = uVar3 ^ uVar7;
      uVar3 = crc32(uVar5,*(undefined8 *)((long)key + 0x18));
      uVar5 = uVar3 ^ uVar5;
      key = (uint8_t *)((long)key + 0x20);
    } while (key <= puVar1 + -8);
    uVar3 = (uVar5 + uVar2) * 0xc83a91e1 + uVar6;
    uVar7 = (uVar3 >> 0x22 | uVar3 * 0x40000000) * 0x8648dbdb ^ uVar7;
    uVar3 = (uVar7 + uVar6) * 0x8648dbdb + uVar2;
    uVar5 = (uVar3 >> 0x25 | uVar3 * 0x8000000) * 0xc83a91e1 ^ uVar5;
    uVar3 = (uVar7 + uVar2) * 0xc83a91e1 + uVar5;
    uVar2 = uVar2 ^ (uVar3 >> 0x22 | uVar3 * 0x40000000) * 0x8648dbdb;
    uVar7 = (uVar5 + uVar6) * 0x8648dbdb + uVar7;
    uVar6 = uVar6 ^ (uVar7 >> 0x25 | uVar7 * 0x8000000) * 0xc83a91e1;
  }
  if (0xf < (long)puVar1 - (long)key) {
    uVar2 = *(long *)key * 0x7bdec03b + uVar2;
    uVar2 = uVar2 >> 0x22 | uVar2 * 0x40000000;
    uVar6 = *(long *)((long)key + 8) * 0x7bdec03b + uVar6;
    key = (uint8_t *)((long)key + 0x10);
    uVar5 = uVar6 >> 0x22 | uVar6 * 0x40000000;
    uVar6 = uVar5 * 0x2f5870a5;
    uVar7 = uVar2 * 0x16e8b05e33f3b607 + uVar6;
    uVar2 = (uVar7 >> 0x1e | uVar7 << 0x22) * 0x8648dbdb ^ uVar2 * 0x2f5870a5;
    uVar7 = uVar5 * 0x8c197ea3900ca59 + uVar2;
    uVar6 = (uVar7 >> 0x1e | uVar7 << 0x22) * 0xc83a91e1 ^ uVar6;
  }
  if (7 < (long)puVar1 - (long)key) {
    uVar2 = *(long *)key * 0x7bdec03b + uVar2;
    key = (uint8_t *)((long)key + 8);
    uVar2 = uVar2 >> 0x24 | uVar2 * 0x10000000;
    uVar7 = uVar2 * 0x16e8b05e33f3b607 + uVar6;
    uVar2 = (uVar7 >> 0x17 | uVar7 << 0x29) * 0x8648dbdb ^ uVar2 * 0x2f5870a5;
  }
  if (3 < (long)puVar1 - (long)key) {
    uVar5 = crc32(uVar2,(ulong)*(uint *)key);
    key = (uint8_t *)((long)key + 4);
    uVar7 = (uVar5 ^ uVar6) * 0x2f5870a5 + uVar2;
    uVar6 = (uVar7 >> 0x13 | uVar7 << 0x2d) * 0xc83a91e1 ^ uVar5 ^ uVar6;
  }
  if (1 < (long)puVar1 - (long)key) {
    uVar5 = crc32(uVar6,(ulong)(ushort)*(uint *)key);
    key = (uint8_t *)((long)key + 2);
    uVar7 = (uVar5 ^ uVar2) * 0x7bdec03b + uVar6;
    uVar2 = (uVar7 >> 0xd | uVar7 << 0x33) * 0x8648dbdb ^ uVar5 ^ uVar2;
  }
  if (puVar1 != (uint *)key && -1 < (long)puVar1 - (long)key) {
    uVar5 = crc32(uVar2,(ulong)(byte)*(uint *)key);
    uVar7 = (uVar5 ^ uVar6) * 0x2f5870a5 + uVar2;
    uVar6 = (uVar7 >> 0x11 | uVar7 << 0x2f) * 0xc83a91e1 ^ uVar5 ^ uVar6;
  }
  uVar7 = uVar2 * 0xc83a91e1 + uVar6;
  lVar8 = (uVar7 >> 0xb | uVar7 << 0x35) + uVar2;
  uVar2 = uVar6 * 0x8648dbdb + lVar8;
  lVar4 = (uVar2 >> 0x1a | uVar2 << 0x26) + uVar6;
  uVar2 = lVar8 * 0xc83a91e1 + lVar4;
  lVar8 = (uVar2 >> 0xb | uVar2 << 0x35) + lVar8;
  uVar2 = lVar4 * 0x8648dbdb + lVar8;
  *(long *)out = lVar8;
  *(ulong *)(out + 8) = (uVar2 >> 0x1a | uVar2 << 0x26) + lVar4;
  return;
}

Assistant:

void metrohash128crc_1(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xC83A91E1;
    static const uint64_t k1 = 0x8648DBDB;
    static const uint64_t k2 = 0x7BDEC03B;
    static const uint64_t k3 = 0x2F5870A5;

    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(key);
    const uint8_t * const end = ptr + len;
    
    uint64_t v[4];
    
    v[0] = ((static_cast<uint64_t>(seed) - k0) * k3) + len;
    v[1] = ((static_cast<uint64_t>(seed) + k1) * k2) + len;
    
    if (len >= 32)
    {        
        v[2] = ((static_cast<uint64_t>(seed) + k0) * k2) + len;
        v[3] = ((static_cast<uint64_t>(seed) - k1) * k3) + len;

        do
        {
            v[0] ^= _mm_crc32_u64(v[0], read_u64(ptr)); ptr += 8;
            v[1] ^= _mm_crc32_u64(v[1], read_u64(ptr)); ptr += 8;
            v[2] ^= _mm_crc32_u64(v[2], read_u64(ptr)); ptr += 8;
            v[3] ^= _mm_crc32_u64(v[3], read_u64(ptr)); ptr += 8;
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 34) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 37) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 34) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 37) * k0;
    }
    
    if ((end - ptr) >= 16)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],34) * k3;
        v[1] += read_u64(ptr) * k2; ptr += 8; v[1] = rotate_right(v[1],34) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 30) * k1;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 30) * k0;
    }
    
    if ((end - ptr) >= 8)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],36) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 23) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u32(ptr)); ptr += 4;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 19) * k0;
    }
    
    if ((end - ptr) >= 2)
    {
        v[0] ^= _mm_crc32_u64(v[1], read_u16(ptr)); ptr += 2;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 13) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u8 (ptr));
        v[1] ^= rotate_right((v[1] * k3) + v[0], 17) * k0;
    }
    
    v[0] += rotate_right((v[0] * k0) + v[1], 11);
    v[1] += rotate_right((v[1] * k1) + v[0], 26);
    v[0] += rotate_right((v[0] * k0) + v[1], 11);
    v[1] += rotate_right((v[1] * k1) + v[0], 26);

    memcpy(out, v, 16);
}